

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O1

bool __thiscall
SmallDenseSet<TypePair,_TypePairHasher,_4U>::contains
          (SmallDenseSet<TypePair,_TypePairHasher,_4U> *this,TypePair *key)

{
  uint uVar1;
  TypeBase *pTVar2;
  TypeBase *pTVar3;
  byte in_AL;
  uint uVar4;
  uint uVar5;
  bool bVar6;
  
  uVar1 = this->bucketCount;
  if (uVar1 == 0) {
    in_AL = 0;
  }
  else {
    uVar4 = key->b->nameHash + key->a->nameHash & uVar1 - 1;
    uVar5 = 1;
    do {
      pTVar2 = this->data[uVar4].a;
      pTVar3 = this->data[uVar4].b;
      if (pTVar2 == (TypeBase *)0x0 && pTVar3 == (TypeBase *)0x0) {
        bVar6 = false;
        in_AL = 0;
      }
      else if (pTVar3 == key->b && pTVar2 == key->a) {
        in_AL = 1;
        bVar6 = false;
      }
      else {
        uVar4 = uVar4 + uVar5 & uVar1 - 1;
        bVar6 = true;
      }
      if (!bVar6) goto LAB_002125dc;
      bVar6 = uVar5 != uVar1;
      uVar5 = uVar5 + 1;
    } while (bVar6);
    in_AL = 0;
  }
LAB_002125dc:
  return (bool)(in_AL & 1);
}

Assistant:

bool contains(const Key& key)
	{
		unsigned bucketMask = bucketCount - 1;
		unsigned bucket = Hasher()(key) & bucketMask;

		for(unsigned i = 0; i < bucketCount; i++)
		{
			Key &item = data[bucket];

			if(item == Key())
				return false;

			if(item == key)
				return true;

			// Quadratic probing
			bucket = (bucket + i + 1) & bucketMask;
		}

		return false;
	}